

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t __thiscall slang::SVInt::reductionOr(SVInt *this)

{
  bool bVar1;
  uint32_t uVar2;
  SVInt *in_RDI;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  uint local_1c;
  uint local_18;
  logic_t local_1;
  
  if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
    bVar1 = isSingleWord(in_RDI);
    if (bVar1) {
      logic_t::logic_t(&local_1,(in_RDI->super_SVIntStorage).field_0.val != 0);
    }
    else {
      for (local_1c = 0; uVar2 = getNumWords((SVInt *)0x354d99), local_1c < uVar2;
          local_1c = local_1c + 1) {
        if ((in_RDI->super_SVIntStorage).field_0.pVal[local_1c] != 0) {
          logic_t::logic_t(&local_1,'\x01');
          return (logic_t)local_1.value;
        }
      }
      logic_t::logic_t(&local_1,'\0');
    }
  }
  else {
    uVar2 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
    for (local_18 = 0; local_18 < uVar2; local_18 = local_18 + 1) {
      if (((in_RDI->super_SVIntStorage).field_0.pVal[local_18] &
          ((in_RDI->super_SVIntStorage).field_0.pVal[local_18 + uVar2] ^ 0xffffffffffffffff)) != 0)
      {
        logic_t::logic_t(&local_1,'\x01');
        return (logic_t)local_1.value;
      }
    }
    local_1.value = 0x80;
  }
  return (logic_t)local_1.value;
}

Assistant:

logic_t SVInt::reductionOr() const {
    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words; i++) {
            if (pVal[i] & ~pVal[i + words])
                return logic_t(true);
        }
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val != 0);
    else {
        for (uint32_t i = 0; i < getNumWords(); i++) {
            if (pVal[i] != 0)
                return logic_t(true);
        }
    }
    return logic_t(false);
}